

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

FontSpec * conf_get_fontspec(Conf *conf,int primary)

{
  void *pvVar1;
  conf_entry *entry;
  key key;
  int primary_local;
  Conf *conf_local;
  
  key.secondary._4_4_ = primary;
  if (subkeytypes[primary] != 0) {
    __assert_fail("subkeytypes[primary] == TYPE_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x18e,"FontSpec *conf_get_fontspec(Conf *, int)");
  }
  if (valuetypes[primary] == 5) {
    entry._0_4_ = primary;
    pvVar1 = find234(conf->tree,&entry,(cmpfn234)0x0);
    if (pvVar1 != (void *)0x0) {
      return *(FontSpec **)((long)pvVar1 + 0x10);
    }
    __assert_fail("entry",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x192,"FontSpec *conf_get_fontspec(Conf *, int)");
  }
  __assert_fail("valuetypes[primary] == TYPE_FONT",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",399
                ,"FontSpec *conf_get_fontspec(Conf *, int)");
}

Assistant:

FontSpec *conf_get_fontspec(Conf *conf, int primary)
{
    struct key key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_NONE);
    assert(valuetypes[primary] == TYPE_FONT);
    key.primary = primary;
    entry = find234(conf->tree, &key, NULL);
    assert(entry);
    return entry->value.u.fontval;
}